

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InstructionFolder::FoldBinaryIntegerOpToConstant
          (InstructionFolder *this,Instruction *inst,function<unsigned_int_(unsigned_int)> *id_map,
          uint32_t *result)

{
  Op OVar1;
  uint **ppuVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int32_t iVar7;
  ConstantManager *this_00;
  Operand *pOVar8;
  uint **ppuVar9;
  Constant *pCVar10;
  undefined4 extraout_var;
  uint32_t i;
  bool bVar12;
  long lVar13;
  IntConstant *constants [2];
  IntConstant *pIVar11;
  
  OVar1 = inst->opcode_;
  this_00 = IRContext::get_constant_mgr(this->context_);
  for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
    pOVar8 = Instruction::GetInOperand(inst,(uint32_t)lVar13);
    if (pOVar8->type != SPV_OPERAND_TYPE_ID) goto LAB_001e44fa;
    ppuVar2 = (uint **)(pOVar8->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar9 = &(pOVar8->words).small_data_;
    if (ppuVar2 != (uint **)0x0) {
      ppuVar9 = ppuVar2;
    }
    uVar3 = std::function<unsigned_int_(unsigned_int)>::operator()(id_map,**ppuVar9);
    pCVar10 = analysis::ConstantManager::FindDeclaredConstant(this_00,uVar3);
    if (pCVar10 == (Constant *)0x0) {
      pIVar11 = (IntConstant *)0x0;
    }
    else {
      iVar4 = (*pCVar10->_vptr_Constant[0xe])(pCVar10);
      pIVar11 = (IntConstant *)CONCAT44(extraout_var,iVar4);
    }
    constants[lVar13] = pIVar11;
  }
  bVar12 = false;
  switch(OVar1) {
  case OpUGreaterThan:
    if ((constants[0] != (IntConstant *)0x0) &&
       (iVar4 = (*(constants[0]->super_ScalarConstant).super_Constant._vptr_Constant[0x17])(),
       (char)iVar4 != '\0')) goto LAB_001e4528;
    uVar6 = 0;
    if (constants[1] == (IntConstant *)0x0) {
      return false;
    }
    uVar5 = analysis::ScalarConstant::GetU32BitValue(&constants[1]->super_ScalarConstant);
    if (uVar5 != 0xffffffff) {
      return false;
    }
    break;
  case OpSGreaterThan:
    if (constants[0] != (IntConstant *)0x0) {
      analysis::IntConstant::GetS32BitValue(constants[0]);
    }
    uVar6 = 0;
    if (constants[1] == (IntConstant *)0x0) {
      return false;
    }
    iVar7 = analysis::IntConstant::GetS32BitValue(constants[1]);
    if (iVar7 != 0x7fffffff) {
      return false;
    }
    break;
  case OpUGreaterThanEqual:
    if (((constants[0] == (IntConstant *)0x0) ||
        (uVar6 = analysis::ScalarConstant::GetU32BitValue(&constants[0]->super_ScalarConstant),
        uVar6 != 0xffffffff)) &&
       ((constants[1] == (IntConstant *)0x0 ||
        (uVar6 = analysis::ScalarConstant::GetU32BitValue(&constants[1]->super_ScalarConstant),
        uVar6 != 0)))) goto LAB_001e44fa;
LAB_001e44f5:
    uVar6 = 1;
    break;
  case OpSGreaterThanEqual:
    if ((constants[0] != (IntConstant *)0x0) &&
       (iVar7 = analysis::IntConstant::GetS32BitValue(constants[0]), iVar7 == 0x7fffffff))
    goto LAB_001e44f5;
    if (constants[1] != (IntConstant *)0x0) {
      analysis::IntConstant::GetS32BitValue(constants[1]);
    }
    goto LAB_001e44fa;
  case OpULessThan:
    if ((constants[0] != (IntConstant *)0x0) &&
       (uVar6 = analysis::ScalarConstant::GetU32BitValue(&constants[0]->super_ScalarConstant),
       uVar6 == 0xffffffff)) goto LAB_001e4528;
    uVar6 = 0;
    if (constants[1] == (IntConstant *)0x0) {
      return false;
    }
    uVar5 = analysis::ScalarConstant::GetU32BitValue(&constants[1]->super_ScalarConstant);
    if (uVar5 != 0) {
      return false;
    }
    break;
  case OpSLessThan:
    if ((constants[0] == (IntConstant *)0x0) ||
       (iVar7 = analysis::IntConstant::GetS32BitValue(constants[0]), iVar7 != 0x7fffffff)) {
      if (constants[1] == (IntConstant *)0x0) {
        return false;
      }
      analysis::IntConstant::GetS32BitValue(constants[1]);
      return false;
    }
LAB_001e4528:
    uVar6 = 0;
    break;
  case OpULessThanEqual:
    if (((constants[0] != (IntConstant *)0x0) &&
        (iVar4 = (*(constants[0]->super_ScalarConstant).super_Constant._vptr_Constant[0x17])(),
        (char)iVar4 != '\0')) ||
       ((constants[1] != (IntConstant *)0x0 &&
        (uVar6 = analysis::ScalarConstant::GetU32BitValue(&constants[1]->super_ScalarConstant),
        uVar6 == 0xffffffff)))) goto LAB_001e44f5;
    goto LAB_001e44fa;
  case OpSLessThanEqual:
    uVar6 = 1;
    if (constants[0] != (IntConstant *)0x0) {
      analysis::IntConstant::GetS32BitValue(constants[0]);
    }
    if ((constants[1] == (IntConstant *)0x0) ||
       (iVar7 = analysis::IntConstant::GetS32BitValue(constants[1]), iVar7 != 0x7fffffff))
    goto LAB_001e44fa;
    break;
  case OpFOrdEqual:
  case OpFUnordEqual:
  case OpFOrdNotEqual:
  case OpFUnordNotEqual:
  case OpFOrdLessThan:
  case OpFUnordLessThan:
  case OpFOrdGreaterThan:
  case OpFUnordGreaterThan:
  case OpFOrdLessThanEqual:
  case OpFUnordLessThanEqual:
  case OpFOrdGreaterThanEqual:
  case OpFUnordGreaterThanEqual:
  case OpIAdd|OpCopyMemorySized:
  case OpIAdd|OpAccessChain:
  case OpShiftRightArithmetic:
  case OpBitwiseXor:
    goto switchD_001e4289_caseD_b4;
  case OpShiftRightLogical:
  case OpShiftLeftLogical:
    uVar6 = 0;
    if (constants[1] == (IntConstant *)0x0) {
      return false;
    }
    uVar5 = analysis::ScalarConstant::GetU32BitValue(&constants[1]->super_ScalarConstant);
    if (uVar5 < 0x20) {
      return false;
    }
    break;
  case OpBitwiseOr:
    uVar6 = 0xffffffff;
    for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
      if ((&constants[lVar13]->super_ScalarConstant != (ScalarConstant *)0x0) &&
         (uVar5 = analysis::ScalarConstant::GetU32BitValue(&constants[lVar13]->super_ScalarConstant)
         , uVar5 == 0xffffffff)) goto LAB_001e452a;
    }
    goto LAB_001e44fa;
  case OpBitwiseAnd:
    for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
      if ((constants[lVar13] != (IntConstant *)0x0) &&
         (iVar4 = (*(constants[lVar13]->super_ScalarConstant).super_Constant._vptr_Constant[0x17])()
         , (char)iVar4 != '\0')) goto LAB_001e4528;
    }
    goto LAB_001e44fa;
  default:
    uVar3 = OVar1 - OpIMul;
    if (7 < uVar3) {
      return false;
    }
    if ((0xecU >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 != 0) {
        return false;
      }
      for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
        if ((constants[lVar13] != (IntConstant *)0x0) &&
           (iVar4 = (*(constants[lVar13]->super_ScalarConstant).super_Constant._vptr_Constant[0x17])
                              (), (char)iVar4 != '\0')) goto LAB_001e4528;
      }
    }
    else {
      for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
        if ((constants[lVar13] != (IntConstant *)0x0) &&
           (iVar4 = (*(constants[lVar13]->super_ScalarConstant).super_Constant._vptr_Constant[0x17])
                              (), (char)iVar4 != '\0')) goto LAB_001e4528;
      }
    }
LAB_001e44fa:
    bVar12 = false;
    goto switchD_001e4289_caseD_b4;
  }
LAB_001e452a:
  *result = uVar6;
  bVar12 = true;
switchD_001e4289_caseD_b4:
  return bVar12;
}

Assistant:

bool InstructionFolder::FoldBinaryIntegerOpToConstant(
    Instruction* inst, const std::function<uint32_t(uint32_t)>& id_map,
    uint32_t* result) const {
  spv::Op opcode = inst->opcode();
  analysis::ConstantManager* const_manger = context_->get_constant_mgr();

  uint32_t ids[2];
  const analysis::IntConstant* constants[2];
  for (uint32_t i = 0; i < 2; i++) {
    const Operand* operand = &inst->GetInOperand(i);
    if (operand->type != SPV_OPERAND_TYPE_ID) {
      return false;
    }
    ids[i] = id_map(operand->words[0]);
    const analysis::Constant* constant =
        const_manger->FindDeclaredConstant(ids[i]);
    constants[i] = (constant != nullptr ? constant->AsIntConstant() : nullptr);
  }

  switch (opcode) {
    // Arthimetics
    case spv::Op::OpIMul:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr && constants[i]->IsZero()) {
          *result = 0;
          return true;
        }
      }
      break;
    case spv::Op::OpUDiv:
    case spv::Op::OpSDiv:
    case spv::Op::OpSRem:
    case spv::Op::OpSMod:
    case spv::Op::OpUMod:
      // This changes undefined behaviour (ie divide by 0) into a 0.
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr && constants[i]->IsZero()) {
          *result = 0;
          return true;
        }
      }
      break;

    // Shifting
    case spv::Op::OpShiftRightLogical:
    case spv::Op::OpShiftLeftLogical:
      if (constants[1] != nullptr) {
        // When shifting by a value larger than the size of the result, the
        // result is undefined.  We are setting the undefined behaviour to a
        // result of 0.  If the shift amount is the same as the size of the
        // result, then the result is defined, and it 0.
        uint32_t shift_amount = constants[1]->GetU32BitValue();
        if (shift_amount >= 32) {
          *result = 0;
          return true;
        }
      }
      break;

    // Bitwise operations
    case spv::Op::OpBitwiseOr:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          // TODO: Change the mask against a value based on the bit width of the
          // instruction result type.  This way we can handle say 16-bit values
          // as well.
          uint32_t mask = constants[i]->GetU32BitValue();
          if (mask == 0xFFFFFFFF) {
            *result = 0xFFFFFFFF;
            return true;
          }
        }
      }
      break;
    case spv::Op::OpBitwiseAnd:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          if (constants[i]->IsZero()) {
            *result = 0;
            return true;
          }
        }
      }
      break;

    // Comparison
    case spv::Op::OpULessThan:
      if (constants[0] != nullptr &&
          constants[0]->GetU32BitValue() == UINT32_MAX) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr && constants[1]->GetU32BitValue() == 0) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpSLessThan:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MAX) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MIN) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpUGreaterThan:
      if (constants[0] != nullptr && constants[0]->IsZero()) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetU32BitValue() == UINT32_MAX) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpSGreaterThan:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MIN) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MAX) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpULessThanEqual:
      if (constants[0] != nullptr && constants[0]->IsZero()) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetU32BitValue() == UINT32_MAX) {
        *result = true;
        return true;
      }
      break;
    case spv::Op::OpSLessThanEqual:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MIN) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MAX) {
        *result = true;
        return true;
      }
      break;
    case spv::Op::OpUGreaterThanEqual:
      if (constants[0] != nullptr &&
          constants[0]->GetU32BitValue() == UINT32_MAX) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr && constants[1]->GetU32BitValue() == 0) {
        *result = true;
        return true;
      }
      break;
    case spv::Op::OpSGreaterThanEqual:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MAX) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MIN) {
        *result = true;
        return true;
      }
      break;
    default:
      break;
  }
  return false;
}